

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlrelationaltablemodel.cpp
# Opt level: O1

QVariant * __thiscall
QSqlRelationalTableModel::data
          (QVariant *__return_storage_ptr__,QSqlRelationalTableModel *this,QModelIndex *index,
          int role)

{
  QSqlRecord *this_00;
  long lVar1;
  QRelation *this_01;
  Data *dd;
  undefined4 uVar2;
  int iVar3;
  ulong uVar4;
  QVariant *pQVar5;
  long in_FS_OFFSET;
  bool bVar6;
  QString local_98;
  int local_7c;
  ModifiedRow local_78;
  undefined1 local_58 [16];
  QSqlRecord local_48;
  ulong uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((role == 0) && (uVar4 = (ulong)index->c, -1 < (long)uVar4)) &&
     (lVar1 = *(long *)(this + 8), uVar4 < *(ulong *)(lVar1 + 0x2f8))) {
    this_01 = *(QRelation **)(*(long *)(lVar1 + 0x2f0) + uVar4 * 0x10);
    if (((this_01->rel).tName.d.size == 0) || ((this_01->rel).iColumn.d.size == 0)) {
      bVar6 = false;
    }
    else {
      bVar6 = (this_01->rel).dColumn.d.size != 0;
    }
    if ((bVar6) && (this_01->m_parent != (QSqlRelationalTableModel *)0x0)) {
      dd = *(Data **)(*(long *)(lVar1 + 0x2f0) + uVar4 * 0x10 + 8);
      if (dd != (Data *)0x0) {
        LOCK();
        (dd->weakref)._q_value.super___atomic_base<int>._M_i =
             (dd->weakref)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        LOCK();
        (dd->strongref)._q_value.super___atomic_base<int>._M_i =
             (dd->strongref)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      if (this_01->m_dictInitialized == false) {
        QRelation::populateDictionary(this_01);
      }
      if (*(int *)(lVar1 + 0x238) != 0) {
        local_78.m_db_values.d.d.ptr =
             (QExplicitlySharedDataPointer<QSqlRecordPrivate>)
             (totally_ordered_wrapper<QSqlRecordPrivate_*>)0xaaaaaaaaaaaaaaaa;
        local_78.m_submitted = true;
        local_78.m_insert = true;
        local_78._26_6_ = 0xaaaaaaaaaaaa;
        local_78.m_op = 0xaaaaaaaa;
        local_78._4_4_ = 0xaaaaaaaa;
        local_78.m_rec.d.d.ptr =
             (QExplicitlySharedDataPointer<QSqlRecordPrivate>)
             (totally_ordered_wrapper<QSqlRecordPrivate_*>)0xaaaaaaaaaaaaaaaa;
        local_7c = index->r;
        QSqlRecord::QSqlRecord((QSqlRecord *)&local_98);
        local_58._0_8_ = local_58._0_8_ & 0xffffffff00000000;
        QSqlRecord::QSqlRecord((QSqlRecord *)(local_58 + 8));
        QSqlRecord::QSqlRecord(&local_48,(QSqlRecord *)&local_98);
        uStack_40 = CONCAT62(uStack_40._2_6_,1);
        if (local_58._0_4_ != None) {
          uStack_40 = CONCAT71(uStack_40._1_7_,1);
          local_58._0_8_ = local_58._0_8_ & 0xffffffff00000000;
          QSqlRecord::operator=((QSqlRecord *)(local_58 + 8),&local_48);
          uVar2 = local_58._0_4_;
          iVar3 = QSqlRecord::count((QSqlRecord *)(local_58 + 8));
          if (0 < iVar3) {
            iVar3 = iVar3 + 1;
            do {
              QSqlRecord::setGenerated((QSqlRecord *)(local_58 + 8),iVar3 + -2,uVar2 == Delete);
              iVar3 = iVar3 + -1;
            } while (1 < iVar3);
          }
        }
        this_00 = &local_78.m_rec;
        QMap<int,_QSqlTableModelPrivate::ModifiedRow>::value
                  (&local_78,(QMap<int,_QSqlTableModelPrivate::ModifiedRow> *)(lVar1 + 0x2e0),
                   &local_7c,(ModifiedRow *)local_58);
        QSqlRecord::~QSqlRecord(&local_48);
        QSqlRecord::~QSqlRecord((QSqlRecord *)(local_58 + 8));
        QSqlRecord::~QSqlRecord((QSqlRecord *)&local_98);
        if (local_78.m_op != None) {
          bVar6 = QSqlRecord::isGenerated(this_00,index->c);
          if ((bVar6) && ((*(int *)(lVar1 + 0x238) == 2 || (local_78.m_op != Delete)))) {
            local_48.d.d.ptr =
                 (QExplicitlySharedDataPointer<QSqlRecordPrivate>)
                 (totally_ordered_wrapper<QSqlRecordPrivate_*>)0xaaaaaaaaaaaaaaaa;
            uStack_40 = 0xaaaaaaaaaaaaaaaa;
            local_58._0_8_ = (PrivateShared *)0xaaaaaaaaaaaaaaaa;
            local_58._8_8_ = (totally_ordered_wrapper<QSqlRecordPrivate_*>)0xaaaaaaaaaaaaaaaa;
            QSqlRecord::value((QVariant *)local_58,this_00,index->c);
            if (3 < uStack_40) {
              QVariant::toString();
              pQVar5 = QHash<QString,_QVariant>::operator[](&this_01->dictionary,&local_98);
              QVariant::QVariant(__return_storage_ptr__,pQVar5);
              if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
                }
              }
              QVariant::~QVariant((QVariant *)local_58);
              QSqlRecord::~QSqlRecord(&local_78.m_db_values);
              QSqlRecord::~QSqlRecord(this_00);
              QSharedPointer<QRelation>::deref(dd);
              goto LAB_001317b7;
            }
            QVariant::~QVariant((QVariant *)local_58);
          }
        }
        QSqlRecord::~QSqlRecord(&local_78.m_db_values);
        QSqlRecord::~QSqlRecord(this_00);
      }
      QSharedPointer<QRelation>::deref(dd);
    }
  }
  QSqlTableModel::data(__return_storage_ptr__,(QSqlTableModel *)this,index,role);
LAB_001317b7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QSqlRelationalTableModel::data(const QModelIndex &index, int role) const
{
    Q_D(const QSqlRelationalTableModel);

    if (role == Qt::DisplayRole && index.column() >= 0 && index.column() < d->relations.size() &&
            d->relations.at(index.column())->isValid()) {
        auto relation = d->relations.at(index.column());
        if (!relation->isDictionaryInitialized())
            relation->populateDictionary();

        //only perform a dictionary lookup for the display value
        //when the value at index has been changed or added.
        //At an unmodified index, the underlying model will
        //already have the correct display value.
        if (d->strategy != OnFieldChange) {
            const QSqlTableModelPrivate::ModifiedRow row = d->cache.value(index.row());
            if (row.op() != QSqlTableModelPrivate::None && row.rec().isGenerated(index.column())) {
                if (d->strategy == OnManualSubmit || row.op() != QSqlTableModelPrivate::Delete) {
                    QVariant v = row.rec().value(index.column());
                    if (v.isValid())
                        return relation->dictionary[v.toString()];
                }
            }
        }
    }
    return QSqlTableModel::data(index, role);
}